

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::ResultBuilder::allowThrows(ResultBuilder *this)

{
  undefined1 uVar1;
  long *in_RAX;
  IMutableContext *pIVar2;
  long *local_18;
  
  local_18 = in_RAX;
  pIVar2 = getCurrentMutableContext();
  (*(pIVar2->super_IContext)._vptr_IContext[6])(&local_18,pIVar2);
  uVar1 = (**(code **)(*local_18 + 0x20))();
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 0x18))();
  }
  return (bool)uVar1;
}

Assistant:

bool ResultBuilder::allowThrows() const { return getCurrentContext().getConfig()->allowThrows(); }